

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpAgent.cpp
# Opt level: O2

int __thiscall
HttpAgent::sendAndGet
          (HttpAgent *this,HttpRequest *req,HttpResponse *res,string *toSend,BodyHandler *handler)

{
  IReaderWriter *reader;
  _func_int **pp_Var1;
  int iVar2;
  uint uVar3;
  ErrCode EVar4;
  int iVar5;
  ssize_t sVar6;
  char *pcVar7;
  uint8_t *puVar8;
  string *__n;
  size_t sVar9;
  void *__buf;
  bool bVar10;
  BodyHandler *pBVar11;
  int buffer_len;
  int length;
  undefined4 uStack_15c;
  Socket *local_140;
  Address addr;
  URI uri;
  
  __n = toSend;
  pBVar11 = handler;
  URI::URI(&uri,&req->mUri);
  iVar5 = (int)pBVar11;
  URI::getHost_abi_cxx11_((string *)&length,&uri);
  pcVar7 = (char *)CONCAT44(uStack_15c,length);
  iVar2 = URI::getPort(&uri);
  JetHead::Socket::Address::Address(&addr,pcVar7,iVar2);
  std::__cxx11::string::~string((string *)&length);
  local_140 = &this->mSock;
  (this->mSock).mReadTimeout = 5;
  iVar2 = JetHead::Socket::connect(local_140,(int)&addr,(sockaddr *)0xa,(socklen_t)__n);
  if (iVar2 == 0) {
    reader = &(this->mSock).super_IReaderWriter;
    HttpHeaderBase::send((HttpHeaderBase *)req,(int)reader,__buf,(size_t)__n,iVar5);
    if (((void *)toSend->_M_string_length == (void *)0x0) ||
       (sVar6 = JetHead::Socket::write
                          (local_140,(int)(toSend->_M_dataplus)._M_p,
                           (void *)toSend->_M_string_length,(size_t)__n),
       (int)sVar6 == (int)toSend->_M_string_length)) {
      JetHead::CircularBuffer::clear(&this->mBuffer);
      bVar10 = true;
      EVar4 = kReadFailed;
      do {
        iVar2 = JetHead::CircularBuffer::getFreeSpace(&this->mBuffer);
        iVar2 = JetHead::CircularBuffer::fillFromFile(&this->mBuffer,reader,iVar2);
        if (iVar2 < 1) goto LAB_001191ef;
        while (iVar2 = HttpHeaderBase::searchForLine(&this->mBuffer), 0 < iVar2) {
          pp_Var1 = (res->super_HttpHeader).super_HttpHeaderBase._vptr_HttpHeaderBase;
          if (bVar10) {
            uVar3 = (*pp_Var1[2])(res);
          }
          else {
            uVar3 = (*pp_Var1[3])(res);
          }
          bVar10 = false;
          if (-1 < (int)uVar3) {
            bVar10 = false;
            JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)(ulong)uVar3,(size_t)__n);
          }
        }
        iVar2 = HttpHeaderBase::searchForLine(&this->mBuffer);
      } while ((iVar2 != 0) ||
              (iVar2 = JetHead::CircularBuffer::getLength(&this->mBuffer), iVar2 < 2));
      iVar2 = res->mResponseCode;
      JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)0x2,(size_t)__n);
      length = 0;
      EVar4 = HttpHeaderBase::getFieldInt((HttpHeaderBase *)res,0x3f4,&length);
      if (EVar4 == kNoError) {
        while (0 < length) {
          JetHead::CircularBuffer::getBytes(&this->mBuffer,0,&buffer_len);
          sVar9 = (size_t)(uint)length;
          if (length < buffer_len) {
            buffer_len = length;
          }
          if (handler != (BodyHandler *)0x0) {
            sVar9 = *(size_t *)handler;
            (**(code **)(sVar9 + 0x10))(handler);
          }
          JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)(ulong)(uint)buffer_len,sVar9);
          length = length - buffer_len;
          if (length != 0) {
            iVar2 = (**(code **)(*(long *)handler + 0x18))(handler);
            if (iVar2 < 0) goto LAB_001195f5;
            length = 0;
          }
        }
        EVar4 = kNoError;
      }
      else {
        pcVar7 = HttpHeaderBase::getField((HttpHeaderBase *)res,0x410);
        if ((pcVar7 != (char *)0x0) && (iVar5 = strcmp(pcVar7,"chunked"), iVar5 == 0)) {
          while (uVar3 = parseChunkLine(&this->mBuffer,&length), (int)uVar3 < 1) {
            iVar2 = JetHead::CircularBuffer::getFreeSpace(&this->mBuffer);
            iVar2 = JetHead::CircularBuffer::fillFromFile(&this->mBuffer,reader,iVar2);
            if (iVar2 < 0) {
              jh_log_print(0,
                           "int HttpAgent::sendAndGet(HttpRequest &, HttpResponse &, const std::string &, BodyHandler *)"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/HttpAgent.cpp"
                           ,0xd7,"Socket read failed...");
              goto LAB_001195f5;
            }
            iVar5 = JetHead::CircularBuffer::byteAt(&this->mBuffer,0);
            if (iVar5 == 0xd) {
              JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)0x1,(size_t)__n);
            }
            iVar5 = JetHead::CircularBuffer::byteAt(&this->mBuffer,0);
            if (iVar5 == 10) {
              JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)0x1,(size_t)__n);
            }
          }
          JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)(ulong)uVar3,(size_t)__n);
          EVar4 = kNoError;
          while (0 < length) {
            puVar8 = JetHead::CircularBuffer::getBytes(&this->mBuffer,0,&buffer_len);
            if (length < buffer_len) {
              buffer_len = length;
            }
            sVar9 = (size_t)(uint)buffer_len;
            if (buffer_len != 0 && handler != (BodyHandler *)0x0) {
              (**(code **)(*(long *)handler + 0x10))(handler,puVar8,sVar9);
              JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)(ulong)(uint)buffer_len,sVar9);
              length = length - buffer_len;
            }
            if (length != 0) {
              iVar2 = (**(code **)(*(long *)handler + 0x18))(handler,local_140);
              if (iVar2 < 1) {
                EVar4 = kReadFailed;
                if (iVar2 == 0) {
                  EVar4 = kNoError;
                }
                goto LAB_001191ef;
              }
              length = 0;
            }
            iVar2 = JetHead::CircularBuffer::getFreeSpace(&this->mBuffer);
            iVar2 = JetHead::CircularBuffer::fillFromFile(&this->mBuffer,reader,iVar2);
            if (iVar2 < 0) {
              iVar2 = 0x10c;
LAB_001195d7:
              jh_log_print(0,
                           "int HttpAgent::sendAndGet(HttpRequest &, HttpResponse &, const std::string &, BodyHandler *)"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/HttpAgent.cpp"
                           ,iVar2,"Socket read failed...");
LAB_001195f5:
              EVar4 = kReadFailed;
              goto LAB_001191ef;
            }
            iVar5 = JetHead::CircularBuffer::byteAt(&this->mBuffer,0);
            if (iVar5 == 0xd) {
              JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)0x1,sVar9);
            }
            iVar5 = JetHead::CircularBuffer::byteAt(&this->mBuffer,0);
            if (iVar5 == 10) {
              JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)0x1,sVar9);
            }
            while (uVar3 = parseChunkLine(&this->mBuffer,&length), (int)uVar3 < 1) {
              iVar2 = JetHead::CircularBuffer::getFreeSpace(&this->mBuffer);
              iVar2 = JetHead::CircularBuffer::fillFromFile(&this->mBuffer,reader,iVar2);
              if (iVar2 < 0) {
                iVar2 = 0x11a;
                goto LAB_001195d7;
              }
              iVar5 = JetHead::CircularBuffer::byteAt(&this->mBuffer,0);
              if (iVar5 == 0xd) {
                JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)0x1,sVar9);
              }
              iVar5 = JetHead::CircularBuffer::byteAt(&this->mBuffer,0);
              if (iVar5 == 10) {
                JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)0x1,sVar9);
              }
            }
            JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)(ulong)uVar3,sVar9);
          }
        }
      }
      if (handler != (BodyHandler *)0x0) {
        (**(code **)(*(long *)handler + 0x20))(handler,1);
      }
      if ((iVar2 != 0xce) && (iVar2 != 200)) {
        EVar4 = kNotFound;
      }
    }
    else {
      EVar4 = kWriteFailed;
    }
  }
  else {
    res->mResponseCode = -1;
    EVar4 = kConnectionFailed;
  }
LAB_001191ef:
  URI::~URI(&uri);
  return EVar4;
}

Assistant:

int HttpAgent::sendAndGet( HttpRequest &req, HttpResponse &res, 
						   const std::string& toSend, BodyHandler* handler )
{
	URI uri = req.getURI();

	Socket::Address addr( uri.getHost().c_str(), uri.getPort() );
	bool first_line = true;
	int len;
	int ret;
	ErrCode err = kNoError;

	mSock.setReadTimeout( 5 );
	ret = mSock.connect( addr, 10 );

	if (ret != 0)
	{
		LOG_NOTICE("Socket connect failed...");
		res.setResponseCode(-1);
		return kConnectionFailed;
	}

	ret = req.send( &mSock );
	if (not toSend.empty())
	{
		if (mSock.write(toSend.c_str(), toSend.size()) != (int)toSend.size())
		{
			return kWriteFailed;
		}
	}

	mBuffer.clear();
	do
	{
		ret = mBuffer.fillFromFile(&mSock, mBuffer.getFreeSpace());

		if (ret <= 0)
		{
			LOG_NOTICE("Socket read failed...");
			return kReadFailed;
		}

		while (HttpHeaderBase::searchForLine(mBuffer) > 0)
		{
			if (first_line)
			{
				len = res.parseFirstLine(mBuffer);
				first_line = false;
			}
			else
			{
				len = res.parseLine(mBuffer);
			}

			if (len < 0)
			{
				LOG_NOTICE("Problem parsing response...");
			}
			else
			{
				mBuffer.read(NULL, len);
			}
		}
		
	} while (HttpHeaderBase::searchForLine(mBuffer) != HttpHeaderBase::kEOH or
			 mBuffer.getLength() < 2);

	ret = res.getResponseCode();

	// read \r\n from buffer
	mBuffer.read( NULL, 2 );			
	
	// Get Body of Response.

	int read_len, length = 0;	
	err = res.getFieldInt( HttpFieldMap::kFieldContentLength, length );
	if ( err == kNoError )
	{
		const char *buffer;
		int buffer_len;
		
		while ( length > 0 )
		{
			buffer = (const char *)mBuffer.getBytes( 0, buffer_len );
			
			if ( buffer_len > length )
				buffer_len = length;
			
			if ( handler != NULL )
				handler->handleData( buffer, buffer_len );
			
			mBuffer.read( NULL, buffer_len );
			length -= buffer_len;

			if (length)
			{
				ret = handler->handleSocket( mSock, length );	

				if (ret < 0)
					return kReadFailed;
				length = 0;
			}
		}
	}
	else
	{
		const char *encoding = res.getField( HttpFieldMap::kFieldTransferEncoding );

		if ( encoding != NULL && strcmp( encoding, "chunked" ) == 0 )
		{			
			while ((read_len = parseChunkLine( mBuffer, length )) <= 0)
			{
				ret = mBuffer.fillFromFile( &mSock, mBuffer.getFreeSpace() );

				if (ret < 0)
				{
					LOG_ERR("Socket read failed...");
					return kReadFailed;
				}	

				if ( mBuffer.byteAt( 0 ) == '\r' )
					mBuffer.read( NULL, 1 );
				if ( mBuffer.byteAt( 0 ) == '\n' )
					mBuffer.read( NULL, 1 );
				
			}

			mBuffer.read( NULL, read_len );
			
			while ( length > 0 )
			{
				const char *buffer;
				int buffer_len;
			
				while ( length > 0 )
				{
					buffer = (const char *)mBuffer.getBytes( 0, buffer_len );
					
					if ( buffer_len > length )
						buffer_len = length;

					if ( (handler != NULL ) && (buffer_len) )
					{
						handler->handleData( buffer, buffer_len );
					
						mBuffer.read( NULL, buffer_len );
						length -= buffer_len;
					}

					if (length)
					{
						ret = handler->handleSocket( mSock, length );	

						if (ret <= 0)
						{
							if (ret == 0)
								return kNoError;
							else
								return kReadFailed;
						}
						length = 0;
					}

				}

				ret = mBuffer.fillFromFile( &mSock, mBuffer.getFreeSpace() );

				if (ret < 0)
				{
					LOG_ERR("Socket read failed...");
					return kReadFailed;
				}

				if ( mBuffer.byteAt( 0 ) == '\r' )
					mBuffer.read( NULL, 1 );
				if ( mBuffer.byteAt( 0 ) == '\n' )
					mBuffer.read( NULL, 1 );

				while ((read_len = parseChunkLine( mBuffer, length )) <= 0)
				{
					ret = mBuffer.fillFromFile( &mSock, mBuffer.getFreeSpace() );
					if (ret < 0)
					{
						LOG_ERR("Socket read failed...");
						return kReadFailed;
					}

					if ( mBuffer.byteAt( 0 ) == '\r' )
						mBuffer.read( NULL, 1 );
					if ( mBuffer.byteAt( 0 ) == '\n' )
						mBuffer.read( NULL, 1 );
				}

				mBuffer.read( NULL, read_len );
			}
			
			err = kNoError;
		}
	}

	if ( handler != NULL )
		handler->setStop(true);

	if ( !(( ret == 200 ) || ( ret == 206)) )
	{
		LOG_NOTICE("File not found... response code = %d", ret);
		return kNotFound;
	}

	return err;
}